

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

void __thiscall cli::Parser::~Parser(Parser *this)

{
  CmdBase *pCVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppCVar4;
  long lVar5;
  long lVar6;
  
  ppCVar4 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->_commands).
                super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar6 = 0;
    do {
      pCVar1 = (this->_commands).
               super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar6];
      if (pCVar1 != (CmdBase *)0x0) {
        (*pCVar1->_vptr_CmdBase[1])();
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    ppCVar4 = (this->_commands).
              super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppCVar4 != (pointer)0x0) {
    operator_delete(ppCVar4,(long)(this->_commands).
                                  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar4
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_arguments);
  pcVar2 = (this->_general_help_text)._M_dataplus._M_p;
  paVar3 = &(this->_general_help_text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_appname)._M_dataplus._M_p;
  paVar3 = &(this->_appname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Parser() {
			for (size_t i = 0, n = _commands.size(); i < n; ++i) {
				delete _commands[i];
			}
		}